

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckStructure.cpp
# Opt level: O2

bool __thiscall CheckStructure::isOpenedPar(CheckStructure *this,string *ch)

{
  __type _Var1;
  bool bVar2;
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  _Var1 = std::operator==(ch,(this->delimiters).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  bVar2 = true;
  if (!_Var1) {
    _Var1 = std::operator==(ch,(this->delimiters).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 5);
    if (_Var1) {
      this->m_countCalls = this->m_countCalls + 1;
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_38,"wrong char instead of open parentness",&local_39);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->m_errors,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool CheckStructure::isOpenedPar(string ch) {
    if (ch == delimiters[0])
        return true;
    if (ch == delimiters[5]) {
        m_countCalls++;
        return true;
    }
    m_errors.push_back("wrong char instead of open parentness");
    return false;
}